

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

QPointF __thiscall QWidgetTextControl::anchorPosition(QWidgetTextControl *this,QString *name)

{
  QWidgetTextControlPrivate *this_00;
  undefined1 auVar1 [16];
  char cVar2;
  bool bVar3;
  int iVar4;
  long in_FS_OFFSET;
  ulong uVar5;
  double local_c8;
  ulong local_b8;
  double dStack_b0;
  undefined1 local_98 [12];
  int iStack_8c;
  undefined1 *local_88;
  QRectF local_78;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((name->d).size == 0) {
    uVar5 = 0;
  }
  else {
    this_00 = *(QWidgetTextControlPrivate **)(this + 8);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QTextDocument::begin();
    local_b8 = 0;
    dStack_b0 = 0.0;
    local_c8 = 0.0;
    while( true ) {
      cVar2 = QTextBlock::isValid();
      if (cVar2 == '\0') break;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QTextBlock::charFormat();
      bVar3 = QTextCharFormat::isAnchor((QTextCharFormat *)&local_58);
      if (bVar3) {
        QTextCharFormat::anchorNames();
        bVar3 = QListSpecialMethods<QString>::contains
                          ((QListSpecialMethods<QString> *)&local_78,name,CaseSensitive);
        QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_78);
        if (!bVar3) goto LAB_00483d9f;
        iVar4 = QTextBlock::position();
        QWidgetTextControlPrivate::rectForPosition(&local_78,this_00,iVar4);
        local_b8 = CONCAT44(local_78.yp._4_4_,local_78.yp._0_4_);
        dStack_b0 = local_78.w;
        local_c8 = local_78.h;
        bVar3 = true;
      }
      else {
LAB_00483d9f:
        local_88 = &DAT_aaaaaaaaaaaaaaaa;
        local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        stack0xffffffffffffff70 = &DAT_aaaaaaaaaaaaaaaa;
        QTextBlock::begin();
        while ((int)local_88 != iStack_8c) {
          QTextBlock::iterator::fragment();
          QTextFragment::charFormat();
          QTextFormat::operator=((QTextFormat *)&local_58,(QTextFormat *)&local_78);
          QTextFormat::~QTextFormat((QTextFormat *)&local_78);
          bVar3 = QTextCharFormat::isAnchor((QTextCharFormat *)&local_58);
          if (bVar3) {
            QTextCharFormat::anchorNames();
            bVar3 = QListSpecialMethods<QString>::contains
                              ((QListSpecialMethods<QString> *)&local_78,name,CaseSensitive);
            QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_78);
            if (bVar3) {
              iVar4 = QTextFragment::position();
              QWidgetTextControlPrivate::rectForPosition(&local_78,this_00,iVar4);
              local_b8 = CONCAT44(local_78.yp._4_4_,local_78.yp._0_4_);
              dStack_b0 = local_78.w;
              local_48 = (undefined1 *)0x0;
              local_c8 = local_78.h;
              puStack_40 = (undefined1 *)((ulong)puStack_40 & 0xffffffff00000000);
              break;
            }
          }
          QTextBlock::iterator::operator++((iterator *)local_98);
        }
        bVar3 = false;
      }
      QTextFormat::~QTextFormat((QTextFormat *)&local_58);
      if (bVar3) break;
      QTextBlock::next();
      local_48 = (undefined1 *)local_78.xp;
      puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,local_78.yp._0_4_);
    }
    uVar5 = 0;
    if ((0.0 < dStack_b0) && (0.0 < local_c8)) {
      uVar5 = local_b8;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar5;
    return (QPointF)(auVar1 << 0x40);
  }
  __stack_chk_fail();
}

Assistant:

QPointF QWidgetTextControl::anchorPosition(const QString &name) const
{
    Q_D(const QWidgetTextControl);
    if (name.isEmpty())
        return QPointF();

    QRectF r;
    for (QTextBlock block = d->doc->begin(); block.isValid(); block = block.next()) {
        QTextCharFormat format = block.charFormat();
        if (format.isAnchor() && format.anchorNames().contains(name)) {
            r = d->rectForPosition(block.position());
            break;
        }

        for (QTextBlock::Iterator it = block.begin(); !it.atEnd(); ++it) {
            QTextFragment fragment = it.fragment();
            format = fragment.charFormat();
            if (format.isAnchor() && format.anchorNames().contains(name)) {
                r = d->rectForPosition(fragment.position());
                block = QTextBlock();
                break;
            }
        }
    }
    if (!r.isValid())
        return QPointF();
    return QPointF(0, r.top());
}